

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# coap.cpp
# Opt level: O3

Error * __thiscall
ot::commissioner::coap::Coap::SendResponse
          (Error *__return_storage_ptr__,Coap *this,Request *aRequest,Response *aResponse)

{
  byte bVar1;
  long lVar2;
  byte bVar3;
  size_t __n;
  allocator_type local_49;
  time_point<std::chrono::_V2::system_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
  local_48;
  long local_40;
  
  if ((aResponse->mHeader).mMessageId == 0) {
    (aResponse->mHeader).mMessageId = (aRequest->mHeader).mMessageId;
  }
  bVar1 = *(byte *)&aRequest->mHeader >> 4;
  bVar3 = 8;
  if (bVar1 < 8) {
    bVar3 = bVar1;
  }
  std::vector<unsigned_char,std::allocator<unsigned_char>>::vector<unsigned_char_const*,void>
            ((vector<unsigned_char,std::allocator<unsigned_char>> *)&local_48,
             (aRequest->mHeader).mToken,(aRequest->mHeader).mToken + bVar3,&local_49);
  __n = 8;
  if ((ulong)(local_40 - (long)local_48.__d.__r) < 8) {
    __n = local_40 - (long)local_48.__d.__r;
  }
  *(byte *)&aResponse->mHeader = *(byte *)&aResponse->mHeader & 0xf | (char)__n << 4;
  memcpy((aResponse->mHeader).mToken,(void *)local_48.__d.__r,__n);
  if (local_48.__d.__r != 0) {
    operator_delete((void *)local_48.__d.__r);
  }
  aResponse->mEndpoint = aRequest->mEndpoint;
  lVar2 = std::chrono::_V2::system_clock::now();
  local_48.__d.__r = (duration)((this->mResponsesCache).mLifetime.__r * 1000000 + lVar2);
  std::
  _Rb_tree<std::chrono::time_point<std::chrono::_V2::system_clock,std::chrono::duration<long,std::ratio<1l,1000000000l>>>,std::pair<std::chrono::time_point<std::chrono::_V2::system_clock,std::chrono::duration<long,std::ratio<1l,1000000000l>>>const,ot::commissioner::coap::Message>,std::_Select1st<std::pair<std::chrono::time_point<std::chrono::_V2::system_clock,std::chrono::duration<long,std::ratio<1l,1000000000l>>>const,ot::commissioner::coap::Message>>,std::less<std::chrono::time_point<std::chrono::_V2::system_clock,std::chrono::duration<long,std::ratio<1l,1000000000l>>>>,std::allocator<std::pair<std::chrono::time_point<std::chrono::_V2::system_clock,std::chrono::duration<long,std::ratio<1l,1000000000l>>>const,ot::commissioner::coap::Message>>>
  ::
  _M_emplace_equal<std::chrono::time_point<std::chrono::_V2::system_clock,std::chrono::duration<long,std::ratio<1l,1000000000l>>>,ot::commissioner::coap::Message_const&>
            ((_Rb_tree<std::chrono::time_point<std::chrono::_V2::system_clock,std::chrono::duration<long,std::ratio<1l,1000000000l>>>,std::pair<std::chrono::time_point<std::chrono::_V2::system_clock,std::chrono::duration<long,std::ratio<1l,1000000000l>>>const,ot::commissioner::coap::Message>,std::_Select1st<std::pair<std::chrono::time_point<std::chrono::_V2::system_clock,std::chrono::duration<long,std::ratio<1l,1000000000l>>>const,ot::commissioner::coap::Message>>,std::less<std::chrono::time_point<std::chrono::_V2::system_clock,std::chrono::duration<long,std::ratio<1l,1000000000l>>>>,std::allocator<std::pair<std::chrono::time_point<std::chrono::_V2::system_clock,std::chrono::duration<long,std::ratio<1l,1000000000l>>>const,ot::commissioner::coap::Message>>>
              *)&(this->mResponsesCache).mContainer,&local_48,aResponse);
  Send(__return_storage_ptr__,this,aResponse);
  return __return_storage_ptr__;
}

Assistant:

Error Coap::SendResponse(const Request &aRequest, Response &aResponse)
{
    // Set message id to request's id
    if (aResponse.GetMessageId() == 0)
    {
        aResponse.SetMessageId(aRequest.GetMessageId());
    }

    // Set the token to request's token
    aResponse.SetToken(aRequest.GetToken());

    // Set message info
    aResponse.SetEndpoint(aRequest.GetEndpoint());

    // Enqueue response
    mResponsesCache.Put(aResponse);

    return Send(aResponse);
}